

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit,int16_t valueOperand,size_t caseCount,
                        int16_t *caseKeyOperands,int16_t *caseLabelOperands,
                        int16_t defaultLabelOperand,size_t pc)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  size_t i;
  size_t sVar2;
  undefined6 in_register_00000032;
  undefined8 uVar3;
  uint8_t local_50 [8];
  sysbvm_bytecodeJitPCRelocation_t relocation;
  
  uVar3 = CONCAT62(in_register_00000032,valueOperand);
  for (sVar2 = 0; caseCount != sVar2; sVar2 = sVar2 + 1) {
    sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)uVar3);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,valueOperand);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,caseKeyOperands[sVar2]);
    sysbvm_jit_x86_call(jit,sysbvm_tuple_equals);
    local_50[0] = 0x84;
    local_50[1] = 0xc0;
    local_50[2] = '\x0f';
    local_50[3] = 0x85;
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    uVar3 = 8;
    sVar1 = sysbvm_bytecodeJit_addBytes(jit,8,local_50);
    relocation.offset = sVar1 - 4;
    relocation.targetPC = (long)caseLabelOperands[sVar2] + pc;
    relocation.addend = -4;
    relocation_00.targetPC = relocation.targetPC;
    relocation_00.offset = relocation.offset;
    relocation_00.addend = -4;
    sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  }
  sysbvm_jit_jumpRelative(jit,(long)defaultLabelOperand + pc);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit, int16_t valueOperand, size_t caseCount, int16_t *caseKeyOperands, int16_t *caseLabelOperands, int16_t defaultLabelOperand, size_t pc)
{
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, valueOperand);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, caseKeyOperands[i]);
        sysbvm_jit_x86_call(jit, &sysbvm_tuple_equals);

        uint8_t instruction[] = {
            // test AL, AL
            0x84, sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, SYSBVM_X86_RAX),

            // jnz
            0x0F, 0x85, 0x00, 0x00, 0x00, 0x00,
        };

        size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
        sysbvm_bytecodeJitPCRelocation_t relocation = {
            .offset = relocationOffset,
            .targetPC = pc + caseLabelOperands[i],
            .addend = -4,
        };
        sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
    }

    sysbvm_jit_jumpRelative(jit, pc + defaultLabelOperand);
}